

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.cpp
# Opt level: O0

unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> __thiscall
pfederc::Parser::parsePrimary
          (Parser *this,
          unique_ptr<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_> *caps)

{
  bool bVar1;
  TokenType TVar2;
  undefined1 local_30 [16];
  Token *tok;
  unique_ptr<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_> *caps_local;
  Parser *this_local;
  
  caps_local = caps;
  this_local = this;
  local_30._8_8_ =
       Lexer::getCurrentToken
                 ((Lexer *)(caps->_M_t).
                           super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>
                           .super__Head_base<0UL,_pfederc::Capabilities_*,_false>._M_head_impl);
  TVar2 = Token::getType((Token *)local_30._8_8_);
  bVar1 = isTokenTypeOperator(TVar2);
  if (bVar1) {
    parseUnary(this);
  }
  else {
    TVar2 = Token::getType((Token *)local_30._8_8_);
    bVar1 = SUB81(caps,0);
    switch(TVar2) {
    case TOK_DIRECTIVE:
      parseCapabilities(this);
      break;
    case TOK_ENSURE:
      parseCapabilities(this);
      break;
    case TOK_ID:
    case TOK_INT8:
    case TOK_INT16:
    case TOK_INT32:
    case TOK_INT64:
    case TOK_UINT8:
    case TOK_UINT16:
    case TOK_UINT32:
    case TOK_UINT64:
    case TOK_FLT32:
    case TOK_FLT64:
    case TOK_CHAR:
    case TOK_STR:
    case TOK_KW_TRUE:
    case TOK_KW_FALSE:
      Lexer::next((Lexer *)(caps->_M_t).
                           super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>
                           .super__Head_base<0UL,_pfederc::Capabilities_*,_false>._M_head_impl);
      std::make_unique<pfederc::TokenExpr,pfederc::Lexer&,pfederc::Token*const&>
                ((Lexer *)local_30,
                 (Token **)
                 (caps->_M_t).
                 super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>
                 .super__Head_base<0UL,_pfederc::Capabilities_*,_false>._M_head_impl);
      std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>::
      unique_ptr<pfederc::TokenExpr,std::default_delete<pfederc::TokenExpr>,void>
                ((unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>> *)this,
                 (unique_ptr<pfederc::TokenExpr,_std::default_delete<pfederc::TokenExpr>_> *)
                 local_30);
      std::unique_ptr<pfederc::TokenExpr,_std::default_delete<pfederc::TokenExpr>_>::~unique_ptr
                ((unique_ptr<pfederc::TokenExpr,_std::default_delete<pfederc::TokenExpr>_> *)
                 local_30);
      break;
    default:
      std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>::
      unique_ptr<std::default_delete<pfederc::Expr>,void>
                ((unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>> *)this,(nullptr_t)0x0
                );
      break;
    case TOK_KW_FN:
      parseFunction(this,caps);
      break;
    case TOK_KW_LAMBDA:
      parseLambda(this);
      break;
    case TOK_KW_MOD:
      parseModule(this);
      break;
    case TOK_KW_CLASS:
      parseClass(this,caps);
      break;
    case TOK_KW_ENUM:
      parseEnum(this);
      break;
    case TOK_KW_TRAIT:
      parseTrait(this,caps);
      break;
    case TOK_KW_TYPE:
      parseType(this,caps);
      break;
    case TOK_KW_USE:
      parseUse(this);
      break;
    case TOK_KW_IF:
      parseIf(this,bVar1);
      break;
    case TOK_KW_ENSURE:
      parseIf(this,bVar1);
      break;
    case TOK_KW_MATCH:
      parseMatch(this);
      break;
    case TOK_KW_FOR:
      parseFor(this,bVar1);
      break;
    case TOK_KW_DO:
      parseFor(this,bVar1);
      break;
    case TOK_KW_SAFE:
      parseSafe(this);
    }
  }
  return (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
         (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::parsePrimary(std::unique_ptr<Capabilities> &&caps) noexcept {
  Token *const tok = lexer.getCurrentToken();
  if (isTokenTypeOperator(tok->getType()))
    return parseUnary();

  switch (tok->getType()) {
  case TokenType::TOK_ID:
  case TokenType::TOK_INT8:
  case TokenType::TOK_INT16:
  case TokenType::TOK_INT32:
  case TokenType::TOK_INT64:
  case TokenType::TOK_UINT8:
  case TokenType::TOK_UINT16:
  case TokenType::TOK_UINT32:
  case TokenType::TOK_UINT64:
  case TokenType::TOK_FLT32:
  case TokenType::TOK_FLT64:
  case TokenType::TOK_CHAR:
  case TokenType::TOK_STR:
  case TokenType::TOK_KW_TRUE:
  case TokenType::TOK_KW_FALSE:
    lexer.next();
    return std::make_unique<TokenExpr>(lexer, tok);
  case TokenType::TOK_KW_FN:
    return parseFunction(std::move(caps));
  case TokenType::TOK_KW_LAMBDA:
    return parseLambda();
  case TokenType::TOK_KW_MOD:
    return parseModule();
  case TokenType::TOK_KW_CLASS:
    return parseClass(std::move(caps));
  case TokenType::TOK_KW_ENUM:
    return parseEnum();
  case TokenType::TOK_KW_TRAIT:
    return parseTrait(std::move(caps));
  case TokenType::TOK_KW_TYPE:
    return parseType(std::move(caps));
  case TokenType::TOK_KW_USE:
    return parseUse();
  case TokenType::TOK_KW_IF:
    return parseIf();
  case TokenType::TOK_KW_ENSURE:
    return parseIf(true);
  case TokenType::TOK_KW_MATCH:
    return parseMatch();
  case TokenType::TOK_KW_FOR:
    return parseFor();
  case TokenType::TOK_KW_DO:
    return parseFor(true);
  case TokenType::TOK_KW_SAFE:
    return parseSafe();

// capabilties
  case TokenType::TOK_ENSURE:
    return parseCapabilities();
  case TokenType::TOK_DIRECTIVE:
    return parseCapabilities();
  default:
    return nullptr;
  }
}